

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * exprDup(sqlite3 *db,Expr *p,int dupFlags,EdupBuf *pEdupBuf)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  Expr *pOwner;
  Select *pSVar5;
  Window *pWVar6;
  Expr *pEVar7;
  ulong __n;
  size_t sVar8;
  uint uVar9;
  u32 uVar10;
  long in_FS_OFFSET;
  EdupBuf local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (pEdupBuf == (EdupBuf *)0x0) {
    if (dupFlags == 0) {
      uVar9 = 0;
      iVar4 = 0x48;
      if (((p->flags & 0x800) == 0) && ((p->u).zToken != (char *)0x0)) {
        sVar8 = strlen((p->u).zToken);
        uVar9 = ((uint)sVar8 & 0x3fffffff) + 1;
        iVar4 = ((uint)sVar8 & 0x3ffffff8) + 0x50;
      }
    }
    else {
      iVar4 = dupedExprSize(p);
      uVar9 = 0xffffffff;
    }
    pOwner = (Expr *)sqlite3DbMallocRawNN(db,(long)iVar4);
    uVar2 = 0;
  }
  else {
    uVar9 = 0xffffffff;
    pOwner = (Expr *)pEdupBuf->zAlloc;
    uVar2 = 0x8000000;
  }
  local_40.zAlloc = &pOwner->op;
  if (pOwner != (Expr *)0x0) {
    uVar3 = dupedExprStructSize(p,dupFlags);
    if ((((int)uVar9 < 0) && (uVar9 = 0, (p->flags & 0x800) == 0)) && ((p->u).zToken != (char *)0x0)
       ) {
      iVar4 = sqlite3Strlen30((p->u).zToken);
      uVar9 = iVar4 + 1;
    }
    if (dupFlags == 0) {
      __n = 0x48;
      uVar1 = 0x2c;
      if ((p->flags >> 0xe & 1) == 0) {
        uVar1 = 0x48;
      }
      sVar8 = 0x10;
      if ((p->flags >> 0x10 & 1) == 0) {
        sVar8 = (size_t)uVar1;
      }
      memcpy(pOwner,p,sVar8);
      if ((uint)sVar8 < 0x48) {
        memset(&pOwner->op + sVar8,0,0x48 - sVar8);
      }
    }
    else {
      __n = (ulong)(uVar3 & 0xfff);
      memcpy(pOwner,p,__n);
    }
    iVar4 = (int)__n;
    uVar10 = uVar3 & 0x14000 | uVar2 | pOwner->flags & 0xf7febfff;
    pOwner->flags = uVar10;
    if (uVar9 != 0) {
      (pOwner->u).zToken = (char *)(&pOwner->op + __n);
      memcpy(&pOwner->op + __n,(p->u).zToken,(ulong)uVar9);
      iVar4 = iVar4 + uVar9;
      uVar10 = pOwner->flags;
    }
    local_40.zAlloc = &pOwner->op + (iVar4 + 7U & 0xfffffff8);
    if (((uVar10 | p->flags) & 0x810000) == 0) {
      if ((p->flags >> 0xc & 1) == 0) {
        iVar4 = 0;
        if (p->op != 0x92) {
          iVar4 = dupFlags;
        }
        pSVar5 = (Select *)sqlite3ExprListDup(db,(p->x).pList,iVar4);
      }
      else {
        pSVar5 = sqlite3SelectDup(db,(Select *)(p->x).pList,dupFlags);
      }
      (pOwner->x).pList = (ExprList *)pSVar5;
      if ((p->flags & 0x1000000) != 0) {
        pWVar6 = sqlite3WindowDup(db,pOwner,(p->y).pWin);
        (pOwner->y).pWin = pWVar6;
      }
      pEVar7 = p->pLeft;
      if (dupFlags == 0) {
        if (p->op != 0xb2) {
          pEVar7 = sqlite3ExprDup(db,pEVar7,0);
        }
        pOwner->pLeft = pEVar7;
        pEVar7 = sqlite3ExprDup(db,p->pRight,0);
      }
      else {
        if (p->op != 0xb2) {
          if (pEVar7 == (Expr *)0x0) {
            pEVar7 = (Expr *)0x0;
          }
          else {
            pEVar7 = exprDup(db,pEVar7,1,&local_40);
          }
        }
        pOwner->pLeft = pEVar7;
        if (p->pRight == (Expr *)0x0) {
          pEVar7 = (Expr *)0x0;
        }
        else {
          pEVar7 = exprDup(db,p->pRight,1,&local_40);
        }
      }
      pOwner->pRight = pEVar7;
    }
  }
  if (pEdupBuf != (EdupBuf *)0x0) {
    pEdupBuf->zAlloc = (u8 *)local_40;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pOwner;
}

Assistant:

static Expr *exprDup(
  sqlite3 *db,          /* Database connection (for memory allocation) */
  const Expr *p,        /* Expr tree to be duplicated */
  int dupFlags,         /* EXPRDUP_REDUCE for compression.  0 if not */
  EdupBuf *pEdupBuf     /* Preallocated storage space, or NULL */
){
  Expr *pNew;           /* Value to return */
  EdupBuf sEdupBuf;     /* Memory space from which to build Expr object */
  u32 staticFlag;       /* EP_Static if space not obtained from malloc */
  int nToken = -1;       /* Space needed for p->u.zToken.  -1 means unknown */

  assert( db!=0 );
  assert( p );
  assert( dupFlags==0 || dupFlags==EXPRDUP_REDUCE );
  assert( pEdupBuf==0 || dupFlags==EXPRDUP_REDUCE );

  /* Figure out where to write the new Expr structure. */
  if( pEdupBuf ){
    sEdupBuf.zAlloc = pEdupBuf->zAlloc;
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = pEdupBuf->zEnd;
#endif
    staticFlag = EP_Static;
    assert( sEdupBuf.zAlloc!=0 );
    assert( dupFlags==EXPRDUP_REDUCE );
  }else{
    int nAlloc;
    if( dupFlags ){
      nAlloc = dupedExprSize(p);
    }else if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
      nToken = sqlite3Strlen30NN(p->u.zToken)+1;
      nAlloc = ROUND8(EXPR_FULLSIZE + nToken);
    }else{
      nToken = 0;
      nAlloc = ROUND8(EXPR_FULLSIZE);
    }
    assert( nAlloc==ROUND8(nAlloc) );
    sEdupBuf.zAlloc = sqlite3DbMallocRawNN(db, nAlloc);
#ifdef SQLITE_DEBUG
    sEdupBuf.zEnd = sEdupBuf.zAlloc ? sEdupBuf.zAlloc+nAlloc : 0;
#endif

    staticFlag = 0;
  }
  pNew = (Expr *)sEdupBuf.zAlloc;
  assert( EIGHT_BYTE_ALIGNMENT(pNew) );

  if( pNew ){
    /* Set nNewSize to the size allocated for the structure pointed to
    ** by pNew. This is either EXPR_FULLSIZE, EXPR_REDUCEDSIZE or
    ** EXPR_TOKENONLYSIZE. nToken is set to the number of bytes consumed
    ** by the copy of the p->u.zToken string (if any).
    */
    const unsigned nStructSize = dupedExprStructSize(p, dupFlags);
    int nNewSize = nStructSize & 0xfff;
    if( nToken<0 ){
      if( !ExprHasProperty(p, EP_IntValue) && p->u.zToken ){
        nToken = sqlite3Strlen30(p->u.zToken) + 1;
      }else{
        nToken = 0;
      }
    }
    if( dupFlags ){
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >= nNewSize+nToken );
      assert( ExprHasProperty(p, EP_Reduced)==0 );
      memcpy(sEdupBuf.zAlloc, p, nNewSize);
    }else{
      u32 nSize = (u32)exprStructSize(p);
      assert( (int)(sEdupBuf.zEnd - sEdupBuf.zAlloc) >=
                                                   (int)EXPR_FULLSIZE+nToken );
      memcpy(sEdupBuf.zAlloc, p, nSize);
      if( nSize<EXPR_FULLSIZE ){
        memset(&sEdupBuf.zAlloc[nSize], 0, EXPR_FULLSIZE-nSize);
      }
      nNewSize = EXPR_FULLSIZE;
    }

    /* Set the EP_Reduced, EP_TokenOnly, and EP_Static flags appropriately. */
    pNew->flags &= ~(EP_Reduced|EP_TokenOnly|EP_Static);
    pNew->flags |= nStructSize & (EP_Reduced|EP_TokenOnly);
    pNew->flags |= staticFlag;
    ExprClearVVAProperties(pNew);
    if( dupFlags ){
      ExprSetVVAProperty(pNew, EP_Immutable);
    }

    /* Copy the p->u.zToken string, if any. */
    assert( nToken>=0 );
    if( nToken>0 ){
      char *zToken = pNew->u.zToken = (char*)&sEdupBuf.zAlloc[nNewSize];
      memcpy(zToken, p->u.zToken, nToken);
      nNewSize += nToken;
    }
    sEdupBuf.zAlloc += ROUND8(nNewSize);

    if( ((p->flags|pNew->flags)&(EP_TokenOnly|EP_Leaf))==0 ){

      /* Fill in the pNew->x.pSelect or pNew->x.pList member. */
      if( ExprUseXSelect(p) ){
        pNew->x.pSelect = sqlite3SelectDup(db, p->x.pSelect, dupFlags);
      }else{
        pNew->x.pList = sqlite3ExprListDup(db, p->x.pList,
                           p->op!=TK_ORDER ? dupFlags : 0);
      }

#ifndef SQLITE_OMIT_WINDOWFUNC
      if( ExprHasProperty(p, EP_WinFunc) ){
        pNew->y.pWin = sqlite3WindowDup(db, pNew, p->y.pWin);
        assert( ExprHasProperty(pNew, EP_WinFunc) );
      }
#endif /* SQLITE_OMIT_WINDOWFUNC */

      /* Fill in pNew->pLeft and pNew->pRight. */
      if( dupFlags ){
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = p->pLeft ?
                      exprDup(db, p->pLeft, EXPRDUP_REDUCE, &sEdupBuf) : 0;
        }
        pNew->pRight = p->pRight ?
                       exprDup(db, p->pRight, EXPRDUP_REDUCE, &sEdupBuf) : 0;
      }else{
        if( p->op==TK_SELECT_COLUMN ){
          pNew->pLeft = p->pLeft;
          assert( p->pRight==0
               || p->pRight==p->pLeft
               || ExprHasProperty(p->pLeft, EP_Subquery) );
        }else{
          pNew->pLeft = sqlite3ExprDup(db, p->pLeft, 0);
        }
        pNew->pRight = sqlite3ExprDup(db, p->pRight, 0);
      }
    }
  }
  if( pEdupBuf ) memcpy(pEdupBuf, &sEdupBuf, sizeof(sEdupBuf));
  assert( sEdupBuf.zAlloc <= sEdupBuf.zEnd );
  return pNew;
}